

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O0

bool rapidjson::Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
     Transcode<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
               StackStream<char> *os)

{
  Ch c;
  StackStream<char> *os_local;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is_local;
  
  c = EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::Take(is);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  StackStream<char>::Put(os,c);
  return true;
}

Assistant:

static RAPIDJSON_FORCEINLINE bool Transcode(InputStream& is, OutputStream& os) {
        os.Put(is.Take());  // Just copy one code unit. This semantic is different from primary template class.
        return true;
    }